

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O0

int CMAC_Update(CMAC_CTX *ctx,void *in,size_t dlen)

{
  uint inl;
  int iVar1;
  size_t nleft;
  int bl;
  uchar *data;
  size_t local_38;
  uchar *local_28;
  ulong local_20;
  int local_4;
  
  if (ctx->nlast_block == -1) {
    local_4 = 0;
  }
  else if (dlen == 0) {
    local_4 = 1;
  }
  else {
    inl = EVP_CIPHER_CTX_get_block_size((EVP_CIPHER_CTX *)0x3a7cca);
    if ((int)inl < 0) {
      local_4 = 0;
    }
    else {
      local_28 = (uchar *)in;
      local_20 = dlen;
      if (0 < ctx->nlast_block) {
        local_38 = (size_t)(int)(inl - ctx->nlast_block);
        if (dlen < local_38) {
          local_38 = dlen;
        }
        memcpy(ctx->last_block + ctx->nlast_block,in,local_38);
        local_20 = dlen - local_38;
        ctx->nlast_block = ctx->nlast_block + (int)local_38;
        if (local_20 == 0) {
          return 1;
        }
        local_28 = (uchar *)(local_38 + (long)in);
        iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx->cctx,ctx->tbl,ctx->last_block,inl);
        if (iVar1 < 1) {
          return 0;
        }
      }
      for (; (ulong)(long)(int)inl < local_20; local_20 = local_20 - (long)(int)inl) {
        iVar1 = EVP_Cipher((EVP_CIPHER_CTX *)ctx->cctx,ctx->tbl,local_28,inl);
        if (iVar1 < 1) {
          return 0;
        }
        local_28 = local_28 + (int)inl;
      }
      memcpy(ctx->last_block,local_28,local_20);
      ctx->nlast_block = (int)local_20;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int CMAC_Update(CMAC_CTX *ctx, const void *in, size_t dlen)
{
    const unsigned char *data = in;
    int bl;

    if (ctx->nlast_block == -1)
        return 0;
    if (dlen == 0)
        return 1;
    if ((bl = EVP_CIPHER_CTX_get_block_size(ctx->cctx)) < 0)
        return 0;
    /* Copy into partial block if we need to */
    if (ctx->nlast_block > 0) {
        size_t nleft;

        nleft = bl - ctx->nlast_block;
        if (dlen < nleft)
            nleft = dlen;
        memcpy(ctx->last_block + ctx->nlast_block, data, nleft);
        dlen -= nleft;
        ctx->nlast_block += nleft;
        /* If no more to process return */
        if (dlen == 0)
            return 1;
        data += nleft;
        /* Else not final block so encrypt it */
        if (EVP_Cipher(ctx->cctx, ctx->tbl, ctx->last_block, bl) <= 0)
            return 0;
    }
    /* Encrypt all but one of the complete blocks left */
    while (dlen > (size_t)bl) {
        if (EVP_Cipher(ctx->cctx, ctx->tbl, data, bl) <= 0)
            return 0;
        dlen -= bl;
        data += bl;
    }
    /* Copy any data left to last block buffer */
    memcpy(ctx->last_block, data, dlen);
    ctx->nlast_block = dlen;
    return 1;

}